

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_deserialize_container
          (t_perl_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  t_type *ptVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  string *prefix_00;
  string i;
  string size;
  string etype;
  string vtype;
  string ktype;
  t_field fsize;
  t_field fetype;
  t_field fvtype;
  t_field fktype;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  t_field local_2f0;
  t_field local_240;
  t_field local_190;
  t_field local_e0;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::__cxx11::string::string((string *)&local_370,"_size",(allocator *)&local_2f0);
  t_generator::tmp(&local_4f0,(t_generator *)this,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"_ktype",(allocator *)&local_2f0);
  t_generator::tmp(&local_490,(t_generator *)this,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"_vtype",(allocator *)&local_2f0);
  t_generator::tmp(&local_4b0,(t_generator *)this,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3d0,"_etype",(allocator *)&local_2f0);
  t_generator::tmp(&local_4d0,(t_generator *)this,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  ptVar1 = g_type_i32;
  std::__cxx11::string::string((string *)&local_3f0,(string *)&local_4f0);
  t_field::t_field(&local_2f0,ptVar1,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&local_410,(string *)&local_490);
  t_field::t_field(&local_e0,ptVar1,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&local_430,(string *)&local_4b0);
  t_field::t_field(&local_190,ptVar1,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&local_450,(string *)&local_4d0);
  t_field::t_field(&local_240,ptVar1,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_550);
  poVar3 = std::operator<<(poVar3,"my $");
  poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
  poVar3 = std::operator<<(poVar3," = 0;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_550);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_550);
      poVar3 = std::operator<<(poVar3,"$");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3," = {};");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_530);
      poVar3 = std::operator<<(poVar3,"my $");
      poVar3 = std::operator<<(poVar3,(string *)&local_4d0);
      poVar3 = std::operator<<(poVar3," = 0;");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_510);
      poVar3 = std::operator<<(poVar3,"$xfer += $input->readSetBegin(");
      poVar3 = std::operator<<(poVar3,"\\$");
      poVar3 = std::operator<<(poVar3,(string *)&local_4d0);
      poVar3 = std::operator<<(poVar3,", \\$");
      poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_0026cd86:
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_530);
      goto LAB_0026cd9a;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_550);
      poVar3 = std::operator<<(poVar3,"$");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3," = [];");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_530);
      poVar3 = std::operator<<(poVar3,"my $");
      poVar3 = std::operator<<(poVar3,(string *)&local_4d0);
      poVar3 = std::operator<<(poVar3," = 0;");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_510);
      poVar3 = std::operator<<(poVar3,"$xfer += $input->readListBegin(");
      poVar3 = std::operator<<(poVar3,"\\$");
      poVar3 = std::operator<<(poVar3,(string *)&local_4d0);
      poVar3 = std::operator<<(poVar3,", \\$");
      poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_0026cd86;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_550);
    poVar3 = std::operator<<(poVar3,"$");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3," = {};");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_530);
    poVar3 = std::operator<<(poVar3,"my $");
    poVar3 = std::operator<<(poVar3,(string *)&local_490);
    poVar3 = std::operator<<(poVar3," = 0;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_510);
    poVar3 = std::operator<<(poVar3,"my $");
    poVar3 = std::operator<<(poVar3,(string *)&local_4b0);
    poVar3 = std::operator<<(poVar3," = 0;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_550);
    poVar3 = std::operator<<(poVar3,"$xfer += $input->readMapBegin(");
    poVar3 = std::operator<<(poVar3,"\\$");
    poVar3 = std::operator<<(poVar3,(string *)&local_490);
    poVar3 = std::operator<<(poVar3,", \\$");
    poVar3 = std::operator<<(poVar3,(string *)&local_4b0);
    poVar3 = std::operator<<(poVar3,", \\$");
    poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_0026cd9a:
    std::__cxx11::string::~string((string *)&local_550);
  }
  std::__cxx11::string::string((string *)&local_470,"_i",(allocator *)&local_530);
  t_generator::tmp(&local_550,(t_generator *)this,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"for (my $");
  poVar3 = std::operator<<(poVar3,(string *)&local_550);
  poVar3 = std::operator<<(poVar3," = 0; $");
  poVar3 = std::operator<<(poVar3,(string *)&local_550);
  poVar3 = std::operator<<(poVar3," < $");
  poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
  poVar3 = std::operator<<(poVar3,"; ++$");
  poVar3 = std::operator<<(poVar3,(string *)&local_550);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      prefix_00 = &local_330;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,prefix_00);
      goto LAB_0026cf1d;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      prefix_00 = &local_350;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)ttype,prefix_00);
      goto LAB_0026cf1d;
    }
  }
  else {
    prefix_00 = &local_310;
    std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,prefix_00);
LAB_0026cf1d:
    std::__cxx11::string::~string((string *)prefix_00);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_0026cfab;
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "$xfer += $input->readListEnd();";
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "$xfer += $input->readSetEnd();";
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "$xfer += $input->readMapEnd();";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_0026cfab:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)&local_550);
  t_field::~t_field(&local_240);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  t_field::~t_field(&local_2f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4f0);
  return;
}

Assistant:

void t_perl_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  out << indent() << "my $" << size << " = 0;" << endl;

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "$" << prefix << " = {};" << endl << indent() << "my $" << ktype << " = 0;"
        << endl << indent() << "my $" << vtype << " = 0;" << endl;

    out << indent() << "$xfer += $input->readMapBegin("
        << "\\$" << ktype << ", \\$" << vtype << ", \\$" << size << ");" << endl;

  } else if (ttype->is_set()) {

    out << indent() << "$" << prefix << " = {};" << endl << indent() << "my $" << etype << " = 0;"
        << endl << indent() << "$xfer += $input->readSetBegin("
        << "\\$" << etype << ", \\$" << size << ");" << endl;

  } else if (ttype->is_list()) {

    out << indent() << "$" << prefix << " = [];" << endl << indent() << "my $" << etype << " = 0;"
        << endl << indent() << "$xfer += $input->readListBegin("
        << "\\$" << etype << ", \\$" << size << ");" << endl;
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (my $" << i << " = 0; $" << i << " < $" << size << "; ++$" << i << ")"
              << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "$xfer += $input->readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $input->readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "$xfer += $input->readListEnd();" << endl;
  }

  scope_down(out);
}